

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pole_zero_filter.cc
# Opt level: O0

PoleZeroFilter *
webrtc::PoleZeroFilter::Create
          (float *numerator_coefficients,size_t order_numerator,float *denominator_coefficients,
          size_t order_denominator)

{
  size_t order_denominator_local;
  float *denominator_coefficients_local;
  size_t order_numerator_local;
  float *numerator_coefficients_local;
  
  if ((((order_numerator < 0x19) && (order_denominator < 0x19)) &&
      ((*denominator_coefficients != 0.0 || (NAN(*denominator_coefficients))))) &&
     ((numerator_coefficients != (float *)0x0 && (denominator_coefficients != (float *)0x0)))) {
    numerator_coefficients_local = (float *)operator_new(0x200);
    PoleZeroFilter((PoleZeroFilter *)numerator_coefficients_local,numerator_coefficients,
                   order_numerator,denominator_coefficients,order_denominator);
  }
  else {
    numerator_coefficients_local = (float *)0x0;
  }
  return (PoleZeroFilter *)numerator_coefficients_local;
}

Assistant:

PoleZeroFilter* PoleZeroFilter::Create(const float* numerator_coefficients,
                                       size_t order_numerator,
                                       const float* denominator_coefficients,
                                       size_t order_denominator) {
  if (order_numerator > kMaxFilterOrder ||
      order_denominator > kMaxFilterOrder || denominator_coefficients[0] == 0 ||
      numerator_coefficients == NULL || denominator_coefficients == NULL)
    return NULL;
  return new PoleZeroFilter(numerator_coefficients, order_numerator,
                            denominator_coefficients, order_denominator);
}